

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterFinishSetup(Fts5Index *p,Fts5Iter *pIter)

{
  int iVar1;
  Fts5Iter *in_RSI;
  Fts5Iter *in_RDI;
  Fts5SegIter *pSeg_1;
  Fts5SegIter *pSeg;
  int iEq;
  int iIter;
  Fts5SegIter *in_stack_ffffffffffffffe0;
  int bFrom;
  
  bFrom = in_RSI->nSeg;
  while (bFrom = bFrom + -1, 0 < bFrom) {
    iVar1 = fts5MultiIterDoCompare((Fts5Iter *)pSeg,pSeg_1._4_4_);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffe0 = in_RSI->aSeg + iVar1;
      if (*(int *)((long)&in_RDI->pColset + 4) == 0) {
        (*in_stack_ffffffffffffffe0->xNext)
                  ((Fts5Index *)in_RDI,in_stack_ffffffffffffffe0,(int *)0x0);
      }
      fts5MultiIterAdvanced
                ((Fts5Index *)CONCAT44(pSeg_1._4_4_,pSeg_1._0_4_),in_RDI,
                 (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    }
  }
  fts5MultiIterSetEof(in_RSI);
  if (((in_RSI->bSkipEmpty == '\0') ||
      (iVar1 = fts5MultiIterIsEmpty((Fts5Index *)in_RDI,in_RSI), iVar1 == 0)) &&
     (iVar1 = fts5MultiIterIsDeleted(in_RDI), iVar1 == 0)) {
    if ((in_RSI->base).bEof == '\0') {
      (*in_RSI->xSetOutputs)(in_RSI,in_RSI->aSeg + in_RSI->aFirst[1].iFirst);
    }
  }
  else {
    fts5MultiIterNext((Fts5Index *)in_RDI,in_RSI,bFrom,(i64)in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

static void fts5MultiIterFinishSetup(Fts5Index *p, Fts5Iter *pIter){
  int iIter;
  for(iIter=pIter->nSeg-1; iIter>0; iIter--){
    int iEq;
    if( (iEq = fts5MultiIterDoCompare(pIter, iIter)) ){
      Fts5SegIter *pSeg = &pIter->aSeg[iEq];
      if( p->rc==SQLITE_OK ) pSeg->xNext(p, pSeg, 0);
      fts5MultiIterAdvanced(p, pIter, iEq, iIter);
    }
  }
  fts5MultiIterSetEof(pIter);
  fts5AssertMultiIterSetup(p, pIter);

  if( (pIter->bSkipEmpty && fts5MultiIterIsEmpty(p, pIter))
   || fts5MultiIterIsDeleted(pIter)
  ){
    fts5MultiIterNext(p, pIter, 0, 0);
  }else if( pIter->base.bEof==0 ){
    Fts5SegIter *pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
    pIter->xSetOutputs(pIter, pSeg);
  }
}